

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessR::operator()
          (ProcessR *this,iterator_t *str,iterator_t *end)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  size_type sVar4;
  DecPOMDPDiscrete *pDVar5;
  reference pvVar6;
  reference puVar7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *p_Var8;
  E *pEVar9;
  stringstream *psVar10;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RSI;
  long *in_RDI;
  iterator sucSI_last_1;
  iterator sucSI_it_1;
  Index jaI_2;
  iterator jaI_last_2;
  iterator jaI_it_2;
  Index sI_2;
  iterator sI_last_2;
  iterator sI_it_2;
  iterator joI_last;
  iterator joI_it;
  Index si_3;
  Index si_2;
  iterator sucSI_last;
  iterator sucSI_it;
  Index jaI_1;
  iterator jaI_last_1;
  iterator jaI_it_1;
  Index sI_1;
  iterator sI_last_1;
  iterator sI_it_1;
  Index si_1;
  Index jaI;
  iterator jaI_last;
  iterator jaI_it;
  Index sI;
  iterator sI_last;
  iterator sI_it;
  Index si;
  Index joI;
  Index sucSI;
  size_t nrS;
  stringstream ss_2;
  stringstream ss_1;
  double reward;
  stringstream ss;
  stringstream *in_stack_fffffffffffff968;
  E *in_stack_fffffffffffff970;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_fffffffffffff978;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff980;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_5d0;
  uint local_5c4;
  uint *local_5c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_5b8;
  uint local_5ac;
  uint *local_5a8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_5a0;
  uint *local_598;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_590;
  uint local_588;
  uint local_584;
  uint *local_580;
  uint *local_578;
  uint *local_570;
  uint *local_568;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_560;
  uint local_554;
  uint *local_550;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_548;
  uint local_53c;
  uint *local_538;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_530;
  uint local_524;
  uint *local_520;
  uint *local_518;
  uint local_50c;
  uint *local_508;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_500;
  uint local_4f4;
  uint *local_4f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_4e8;
  uint local_4dc;
  value_type local_4d8;
  value_type local_4d4;
  ulong local_4d0;
  stringstream local_4c8 [16];
  ostream local_4b8 [376];
  stringstream local_340 [16];
  ostream local_330 [376];
  undefined8 local_1b8;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  if (*(int *)(*in_RDI + 0x40) != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"ProcessR:last parsed type should be a double. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar2 = DPOMDPFormatParsing::operator<<
                       ((ostream *)in_stack_fffffffffffff970,
                        (file_position *)in_stack_fffffffffffff968);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  local_1b8 = *(undefined8 *)(*in_RDI + 0x18);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x100));
  if (sVar4 == 1) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x118));
    if (sVar4 == 1) {
      pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
      local_4d0 = (**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 0x30))();
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x118),0
                         );
      local_4d4 = *pvVar6;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0xe8),0)
      ;
      local_4d8 = *pvVar6;
      if ((local_4d4 == *(value_type *)(*in_RDI + 0x5c)) &&
         (local_4d8 == *(value_type *)(*in_RDI + 0x58))) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x100)
                            ,0);
        if (*pvVar6 == *(value_type *)(*in_RDI + 0x5c)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa063e8);
          for (local_4dc = 0; local_4dc < local_4d0; local_4dc = local_4dc + 1) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (in_stack_fffffffffffff980,(value_type_conflict1 *)in_stack_fffffffffffff978);
          }
        }
        local_4e8._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffff968);
        local_4f0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       in_stack_fffffffffffff968);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffff970,
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffff968), bVar1) {
          puVar7 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_4e8);
          local_4f4 = *puVar7;
          local_500._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_fffffffffffff968);
          local_508 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         in_stack_fffffffffffff968);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_fffffffffffff970,
                                    (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_fffffffffffff968), bVar1) {
            puVar7 = __gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&local_500);
            local_50c = *puVar7;
            pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
            (**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x180))
                      (local_1b8,pDVar5,local_4f4,local_50c);
            local_518 = (uint *)__gnu_cxx::
                                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                ::operator++(in_stack_fffffffffffff978,
                                             (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
          }
          local_520 = (uint *)__gnu_cxx::
                              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              ::operator++(in_stack_fffffffffffff978,
                                           (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
        }
      }
      else if (local_4d8 == *(value_type *)(*in_RDI + 0x58)) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x100)
                            ,0);
        if (*pvVar6 == *(value_type *)(*in_RDI + 0x5c)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa065f5);
          local_524 = 0;
          while( true ) {
            in_stack_fffffffffffff978 =
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)(ulong)local_524;
            pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
            p_Var8 = (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)(**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                               super_MultiAgentDecisionProcess + 0x30))();
            if (p_Var8 <= in_stack_fffffffffffff978) break;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (in_stack_fffffffffffff980,(value_type_conflict1 *)in_stack_fffffffffffff978);
            local_524 = local_524 + 1;
          }
        }
        local_530._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffff968);
        local_538 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       in_stack_fffffffffffff968);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffff970,
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffff968), bVar1) {
          puVar7 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_530);
          local_53c = *puVar7;
          local_548._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_fffffffffffff968);
          local_550 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         in_stack_fffffffffffff968);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_fffffffffffff970,
                                    (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_fffffffffffff968), bVar1) {
            puVar7 = __gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&local_548);
            local_554 = *puVar7;
            local_560._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    in_stack_fffffffffffff968);
            local_568 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           in_stack_fffffffffffff968);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_fffffffffffff970,
                                      (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_fffffffffffff968), bVar1) {
              puVar7 = __gnu_cxx::
                       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator*(&local_560);
              local_4d4 = *puVar7;
              pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
              (**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x188))
                        (local_1b8,pDVar5,local_53c,local_554,local_4d4);
              local_570 = (uint *)__gnu_cxx::
                                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  ::operator++(in_stack_fffffffffffff978,
                                               (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
            }
            local_578 = (uint *)__gnu_cxx::
                                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                ::operator++(in_stack_fffffffffffff978,
                                             (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
          }
          local_580 = (uint *)__gnu_cxx::
                              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              ::operator++(in_stack_fffffffffffff978,
                                           (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
        }
      }
      else {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x100)
                            ,0);
        if (*pvVar6 == *(value_type *)(*in_RDI + 0x5c)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa068a6);
          local_584 = 0;
          while( true ) {
            in_stack_fffffffffffff970 = (E *)(ulong)local_584;
            pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
            pEVar9 = (E *)(**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                                 super_MultiAgentDecisionProcess + 0x30))();
            if (pEVar9 <= in_stack_fffffffffffff970) break;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (in_stack_fffffffffffff980,(value_type_conflict1 *)in_stack_fffffffffffff978);
            local_584 = local_584 + 1;
          }
        }
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x118)
                            ,0);
        if (*pvVar6 == *(value_type *)(*in_RDI + 0x5c)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa0695f);
          local_588 = 0;
          while( true ) {
            in_stack_fffffffffffff968 = (stringstream *)(ulong)local_588;
            pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
            psVar10 = (stringstream *)
                      (**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                             super_MultiAgentDecisionProcess + 0x30))();
            if (psVar10 <= in_stack_fffffffffffff968) break;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (in_stack_fffffffffffff980,(value_type_conflict1 *)in_stack_fffffffffffff978);
            local_588 = local_588 + 1;
          }
        }
        local_590._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffff968);
        local_598 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       in_stack_fffffffffffff968);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffff970,
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffff968), bVar1) {
          puVar7 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_590);
          local_4d8 = *puVar7;
          local_5a0._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_fffffffffffff968);
          local_5a8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         in_stack_fffffffffffff968);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_fffffffffffff970,
                                    (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_fffffffffffff968), bVar1) {
            puVar7 = __gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&local_5a0);
            local_5ac = *puVar7;
            local_5b8._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    in_stack_fffffffffffff968);
            local_5c0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           in_stack_fffffffffffff968);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_fffffffffffff970,
                                      (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)in_stack_fffffffffffff968), bVar1) {
              puVar7 = __gnu_cxx::
                       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator*(&local_5b8);
              local_5c4 = *puVar7;
              local_5d0._M_current =
                   (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      in_stack_fffffffffffff968);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffff968);
              while (bVar1 = __gnu_cxx::operator!=
                                       ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)in_stack_fffffffffffff970,
                                        (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)in_stack_fffffffffffff968), bVar1) {
                puVar7 = __gnu_cxx::
                         __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         ::operator*(&local_5d0);
                local_4d4 = *puVar7;
                pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
                (**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                       super_MultiAgentDecisionProcess + 400))
                          (local_1b8,pDVar5,local_5ac,local_5c4,local_4d4,local_4d8);
                __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator++(in_stack_fffffffffffff978,
                             (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
              }
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(in_stack_fffffffffffff978,(int)((ulong)in_stack_fffffffffffff970 >> 0x20)
                          );
            }
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(in_stack_fffffffffffff978,(int)((ulong)in_stack_fffffffffffff970 >> 0x20));
          }
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(in_stack_fffffffffffff978,(int)((ulong)in_stack_fffffffffffff970 >> 0x20));
        }
      }
      return;
    }
    std::__cxx11::stringstream::stringstream(local_4c8);
    std::operator<<(local_4b8,"ProcessR: _m_lp_toSI has size != 1. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar2 = DPOMDPFormatParsing::operator<<
                       ((ostream *)in_stack_fffffffffffff970,
                        (file_position *)in_stack_fffffffffffff968);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream(local_340);
  std::operator<<(local_330,"ProcessR: _m_lp_fromSI has size != 1. (at ");
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::get_position(in_RSI);
  poVar2 = DPOMDPFormatParsing::operator<<
                     ((ostream *)in_stack_fffffffffffff970,
                      (file_position *)in_stack_fffffffffffff968);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  uVar3 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  __cxa_throw(uVar3,&E::typeinfo,E::~E);
}

Assistant:

void ParserDPOMDPFormat_Spirit::ProcessR::operator()(iterator_t str, iterator_t end) const
{
    if(_m_po->_m_lp_type != DOUBLE)
    {
        stringstream ss; ss<<"ProcessR:last parsed type should be a double. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    double reward = _m_po->_m_lp_double;
    if(        _m_po-> _m_lp_fromSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessR: _m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }   
    if(        _m_po-> _m_lp_toSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessR: _m_lp_toSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }    
    size_t nrS =  _m_po->GetDecPOMDPDiscrete()->GetNrStates();
    //size_t nrJO = _m_po->GetDecPOMDPDiscrete()->GetNrJointObservations();
    Index sucSI = _m_po-> _m_lp_toSI[0];
    Index joI = _m_po->_m_lp_JOI[0];
    if( sucSI == _m_po->_m_anyStateIndex && joI == _m_po->_m_anyJOIndex) 
    {
        // rewards of the form R: ja : s : * : * : %f, so we can simply do
        // AddReward()
    
        if(_m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex)
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < nrS; si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }            
        
        vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
        vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
        while(sI_it != sI_last)
        {
            Index sI = *sI_it;
            vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
            vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
            while(jaI_it != jaI_last)
            {
                Index jaI = *jaI_it;
                _m_po->GetDecPOMDPDiscrete()->SetReward(sI, jaI, reward);
                if(DEBUG_PARSE)
                    cout << "Setting R("<<sI<<","<<jaI<<") = "<<reward<<endl;
                jaI_it++;
            }
            sI_it++;
        }
    }    
    else if( joI == _m_po->_m_anyJOIndex ) //but end-state is not ANY_INDEX
    {
        if( _m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }
/*        Obsolete test...
        if( sucSI == ANY_INDEX )
        {
            _m_po->_m_lp_toSI.clear();
            for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_toSI.push_back(si);
        }*/
        vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
        vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
        while(sI_it != sI_last)
        {
            Index sI = *sI_it;
            vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
            vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
            while(jaI_it != jaI_last)
            {
                Index jaI = *jaI_it;
                vector<Index>::iterator sucSI_it = _m_po->_m_lp_toSI.begin();
                vector<Index>::iterator sucSI_last = _m_po->_m_lp_toSI.end();
                while(sucSI_it != sucSI_last)
                {
                    sucSI = *sucSI_it; 
                    _m_po->GetDecPOMDPDiscrete()->SetReward(sI, jaI, sucSI, reward);
                    if(DEBUG_PARSE)
                        cout << "Setting R("<<sI<<","<<jaI<<","<<sucSI<<") = "<<
                            reward<<endl;
                    sucSI_it++;
                }
                jaI_it++;
            }
            sI_it++;
        }

    }
    else // both end-state and joI are specified. joI != ANY_INDEX
         // (otherwise it would fall under previous else if )
    {

        if( _m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_fromSI.clear();
            for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_fromSI.push_back(si);
        }
        if( _m_po->_m_lp_toSI[0] == _m_po->_m_anyStateIndex )
        {
            _m_po->_m_lp_toSI.clear();
            for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
                _m_po->_m_lp_toSI.push_back(si);
        }
        vector<Index>::iterator joI_it = _m_po->_m_lp_JOI.begin();
        vector<Index>::iterator joI_last = _m_po->_m_lp_JOI.end();
        while(joI_it != joI_last)
        {
            joI = *joI_it;
            vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
            vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
            while(sI_it != sI_last)
            {
                Index sI = *sI_it;
                vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
                vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
                while(jaI_it != jaI_last)
                {
                    Index jaI = *jaI_it;
                    vector<Index>::iterator sucSI_it = _m_po->_m_lp_toSI.begin();
                    vector<Index>::iterator sucSI_last = _m_po->_m_lp_toSI.end();
                    while(sucSI_it != sucSI_last)
                    {
                        sucSI = *sucSI_it; 
                        _m_po->GetDecPOMDPDiscrete()->SetReward(sI, jaI, sucSI,joI, 
                            reward);
                        if(DEBUG_PARSE)
                            cout << "Setting R("<<sI<<","<<jaI<<","<<sucSI<<
                                ","<<joI<<") = "<<reward<<endl;
                        sucSI_it++;
                    }
                    jaI_it++;
                }
                sI_it++;
            }
            joI_it++;
        }
    } //end else (both end-state and joI are specified)
}